

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O1

void __thiscall
crnlib::command_line_params::find
          (command_line_params *this,char *pKey,param_map_const_iterator *begin,
          param_map_const_iterator *end)

{
  const_iterator cVar1;
  dynamic_string key;
  dynamic_string local_30;
  
  dynamic_string::dynamic_string(&local_30,pKey);
  cVar1 = std::
          _Rb_tree<crnlib::dynamic_string,_std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>,_std::_Select1st<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>,_std::less<crnlib::dynamic_string>,_std::allocator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
          ::lower_bound(&(this->m_param_map)._M_t,&local_30);
  begin->_M_node = cVar1._M_node;
  cVar1 = std::
          _Rb_tree<crnlib::dynamic_string,_std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>,_std::_Select1st<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>,_std::less<crnlib::dynamic_string>,_std::allocator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
          ::upper_bound(&(this->m_param_map)._M_t,&local_30);
  end->_M_node = cVar1._M_node;
  if ((local_30.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_30.m_pStr + -8) ^ *(uint *)(local_30.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_30.m_pStr + -0x10);
  }
  return;
}

Assistant:

void command_line_params::find(const char* pKey, param_map_const_iterator& begin, param_map_const_iterator& end) const
    {
        dynamic_string key(pKey);
        begin = m_param_map.lower_bound(key);
        end = m_param_map.upper_bound(key);
    }